

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O2

lexeme_t<cfgfile::qstring_trait_t> * __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme
          (lexeme_t<cfgfile::qstring_trait_t> *__return_storage_ptr__,
          lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  input_stream_t<cfgfile::qstring_trait_t> *this_00;
  pos_t pVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char_t cVar6;
  exception_t<cfgfile::qstring_trait_t> *peVar7;
  char_t new_char;
  allocator<char> local_22c;
  allocator<char> local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  string local_228;
  string_t result;
  string_t local_1e0;
  string_t local_1c8;
  QString local_1b0;
  string_t local_198;
  string_t local_180;
  qstring_wrapper_t local_168;
  qstring_wrapper_t local_150;
  qstring_wrapper_t local_138;
  qstring_wrapper_t local_120;
  string local_108;
  string local_e8;
  string local_c8;
  string_t local_a8;
  string_t local_90;
  qstring_wrapper_t local_78;
  qstring_wrapper_t local_60;
  qstring_wrapper_t local_48;
  
  result.m_str.d.d = (Data *)0x0;
  result.m_str.d.ptr = (char16_t *)0x0;
  result.m_str.d.size = 0;
  skip_spaces(this);
  this_00 = this->m_stream;
  pVar1 = this_00->m_column_number;
  this->m_line_number = this_00->m_line_number;
  this->m_column_number = pVar1;
  bVar3 = input_stream_t<cfgfile::qstring_trait_t>::at_end(this_00);
  if (!bVar3) {
    bVar3 = true;
    bVar2 = false;
LAB_00119a58:
    cVar6 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
    if (cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_quotes) {
      if (bVar2) goto LAB_00119c25;
      if (!bVar3) {
LAB_00119c1b:
        input_stream_t<cfgfile::qstring_trait_t>::put_back(this->m_stream,cVar6);
        goto LAB_00119c25;
      }
      bVar2 = true;
LAB_00119b0c:
      bVar4 = false;
    }
    else {
      if (cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_back_slash) {
        new_char.ucs = L'\0';
        if ((bVar2) && (bVar4 = process_back_slash(this,&new_char), !bVar4)) {
          peVar7 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"Unrecognized back-slash sequence: \"\\",&local_22c);
          qstring_trait_t::from_ascii(&local_198,&local_228);
          QString::QString(&local_1b0,1,(QChar)new_char.ucs);
          operator+(&local_180,&local_198,(qstring_wrapper_t *)&local_1b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"\". In file \"",&local_229);
          qstring_trait_t::from_ascii(&local_1c8,&local_c8);
          operator+(&local_168,&local_180,&local_1c8);
          operator+(&local_150,&local_168,&this->m_stream->m_file_name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"\" on line ",&local_22a);
          qstring_trait_t::from_ascii(&local_1e0,&local_e8);
          operator+(&local_138,&local_150,&local_1e0);
          qstring_trait_t::to_string(&local_90,this->m_line_number);
          operator+(&local_120,&local_138,&local_90);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,".",&local_22b);
          qstring_trait_t::from_ascii(&local_a8,&local_108);
          operator+(&local_48,&local_120,&local_a8);
          exception_t<cfgfile::qstring_trait_t>::exception_t(peVar7,&local_48);
          __cxa_throw(peVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
        QString::append((QChar)(char16_t)&result);
        goto LAB_00119b0c;
      }
      if (cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_begin_tag) {
        if (result.m_str.d.size != 0) {
LAB_00119af6:
          if (!bVar2) goto LAB_00119c1b;
          goto LAB_00119b00;
        }
        QString::QString((QString *)&local_228,1,(QChar)cVar6.ucs);
        __return_storage_ptr__->m_type = start;
LAB_00119c9c:
        (__return_storage_ptr__->m_value).m_str.d.d = (Data *)local_228._M_dataplus._M_p;
        (__return_storage_ptr__->m_value).m_str.d.ptr = (char16_t *)local_228._M_string_length;
        (__return_storage_ptr__->m_value).m_str.d.size = local_228.field_2._M_allocated_capacity;
        if ((Data *)local_228._M_dataplus._M_p != (Data *)0x0) {
          LOCK();
          *(int *)local_228._M_dataplus._M_p = *(int *)local_228._M_dataplus._M_p + 1;
          UNLOCK();
        }
        goto LAB_00119a41;
      }
      if (cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_end_tag) {
        if (result.m_str.d.size != 0) goto LAB_00119af6;
        QString::QString((QString *)&local_228,1,(QChar)cVar6.ucs);
        __return_storage_ptr__->m_type = finish;
        goto LAB_00119c9c;
      }
      if ((cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_space) ||
         (cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_tab)) {
        if (bVar2) {
LAB_00119b00:
          QString::append((QChar)(char16_t)&result);
          goto LAB_00119b0c;
        }
        goto LAB_00119c25;
      }
      if ((cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_carriage_return) ||
         (cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_line_feed)) {
        if (bVar2) {
          peVar7 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"Unfinished quoted lexeme. ",(allocator<char> *)&local_90)
          ;
          qstring_trait_t::from_ascii(&local_180,&local_228);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"New line detected. In file \"",
                     (allocator<char> *)&local_a8);
          qstring_trait_t::from_ascii(&local_198,&local_c8);
          operator+(&local_168,&local_180,&local_198);
          operator+(&local_150,&local_168,&this->m_stream->m_file_name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"\" on line ",(allocator<char> *)&new_char);
          qstring_trait_t::from_ascii((string_t *)&local_1b0,&local_e8);
          operator+(&local_138,&local_150,(qstring_wrapper_t *)&local_1b0);
          qstring_trait_t::to_string(&local_1c8,this->m_line_number);
          operator+(&local_120,&local_138,&local_1c8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,".",&local_22c);
          qstring_trait_t::from_ascii(&local_1e0,&local_108);
          operator+(&local_60,&local_120,&local_1e0);
          exception_t<cfgfile::qstring_trait_t>::exception_t(peVar7,&local_60);
          __cxa_throw(peVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
        goto LAB_00119c25;
      }
      if (((cVar6.ucs != const_t<cfgfile::qstring_trait_t>::c_vertical_bar) || (bVar2)) ||
         (bVar4 = input_stream_t<cfgfile::qstring_trait_t>::at_end(this->m_stream), bVar4))
      goto LAB_00119b00;
      cVar6 = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
      if (cVar6.ucs == const_t<cfgfile::qstring_trait_t>::c_vertical_bar) {
        skip_one_line_comment(this);
      }
      else {
        if (cVar6.ucs != const_t<cfgfile::qstring_trait_t>::c_sharp) {
          QString::append((QChar)(char16_t)&result);
          input_stream_t<cfgfile::qstring_trait_t>::put_back(this->m_stream,cVar6);
          goto LAB_00119b0c;
        }
        skip_multi_line_comment(this);
      }
      if (!bVar3) goto LAB_00119c25;
      bVar4 = true;
      skip_spaces(this);
    }
    bVar5 = input_stream_t<cfgfile::qstring_trait_t>::at_end(this->m_stream);
    if (!bVar5) {
      if (!bVar4) {
        bVar3 = false;
      }
      goto LAB_00119a58;
    }
    if (bVar2) {
      peVar7 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"Unfinished quoted lexeme. ",(allocator<char> *)&local_90);
      qstring_trait_t::from_ascii(&local_180,&local_228);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"End of file riched. In file \"",(allocator<char> *)&local_a8);
      qstring_trait_t::from_ascii(&local_198,&local_c8);
      operator+(&local_168,&local_180,&local_198);
      operator+(&local_150,&local_168,&this->m_stream->m_file_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"\" on line ",(allocator<char> *)&new_char);
      qstring_trait_t::from_ascii((string_t *)&local_1b0,&local_e8);
      operator+(&local_138,&local_150,(qstring_wrapper_t *)&local_1b0);
      qstring_trait_t::to_string(&local_1c8,this->m_line_number);
      operator+(&local_120,&local_138,&local_1c8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,".",&local_22c);
      qstring_trait_t::from_ascii(&local_1e0,&local_108);
      operator+(&local_78,&local_120,&local_1e0);
      exception_t<cfgfile::qstring_trait_t>::exception_t(peVar7,&local_78);
      __cxa_throw(peVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
    if (result.m_str.d.size != 0) {
LAB_00119c25:
      __return_storage_ptr__->m_type = string;
      (__return_storage_ptr__->m_value).m_str.d.d = result.m_str.d.d;
      (__return_storage_ptr__->m_value).m_str.d.ptr = result.m_str.d.ptr;
      (__return_storage_ptr__->m_value).m_str.d.size = result.m_str.d.size;
      if (result.m_str.d.d != (Data *)0x0) {
        LOCK();
        ((result.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((result.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00119c4f;
    }
  }
  local_228.field_2._M_allocated_capacity = 0;
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  __return_storage_ptr__->m_type = null;
  (__return_storage_ptr__->m_value).m_str.d.d = (Data *)0x0;
  (__return_storage_ptr__->m_value).m_str.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->m_value).m_str.d.size = 0;
LAB_00119a41:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_228);
LAB_00119c4f:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&result);
  return __return_storage_ptr__;
}

Assistant:

lexeme_t< Trait > next_lexeme()
	{
		typename Trait::string_t result;

		bool quoted_lexeme = false;
		bool first_symbol = true;
		bool skip_comment = false;

		skip_spaces();

		m_line_number = m_stream.line_number();
		m_column_number = m_stream.column_number();

		if( m_stream.at_end() )
			return lexeme_t< Trait >( lexeme_type_t::null,
				typename Trait::string_t() );

		while( true )
		{
			typename Trait::char_t ch = m_stream.get();

			if( ch == const_t< Trait >::c_quotes )
			{
				if( quoted_lexeme )
					break;
				else if( first_symbol )
					quoted_lexeme = true;
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_back_slash )
			{
				typename Trait::char_t new_char( 0x00 );

				if( !quoted_lexeme )
					result.push_back( ch );
				else if( process_back_slash( new_char ) )
					result.push_back( new_char );
				else
					throw exception_t< Trait >(
						Trait::from_ascii( "Unrecognized back-slash "
							"sequence: \"\\" ) +
						typename Trait::string_t( 1, new_char ) +
						Trait::from_ascii( "\". In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
			}
			else if( ch == const_t< Trait >::c_begin_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::start,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_end_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::finish,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_space ||
				ch == const_t< Trait >::c_tab )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_carriage_return ||
				ch == const_t< Trait >::c_line_feed )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "New line detected. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_vertical_bar )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					if( !m_stream.at_end() )
					{
						typename Trait::char_t next_char = m_stream.get();

						if( next_char == const_t< Trait >::c_vertical_bar )
						{
							skip_comment = true;

							skip_one_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else if( next_char == const_t< Trait >::c_sharp )
						{
							skip_comment = true;

							skip_multi_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else
						{
							result.push_back( ch );

							m_stream.put_back( next_char );
						}
					}
					else
						result.push_back( ch );
				}
			}
			else
				result.push_back( ch );

			if( m_stream.at_end() )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "End of file riched. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::null,
						typename Trait::string_t() );
				else
					break;
			}

			if( !skip_comment )
				first_symbol = false;
			else
				skip_comment = false;
		}

		return lexeme_t< Trait >( lexeme_type_t::string, result );
	}